

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlSchemaInitTypes(PyObject *self,PyObject *args)

{
  int iVar1;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  iVar1 = libxml_deprecationWarning("xmlSchemaInitTypes");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = xmlSchemaInitTypes();
    self_local = libxml_intWrap(iVar1);
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlSchemaInitTypes(PyObject *self ATTRIBUTE_UNUSED, PyObject *args ATTRIBUTE_UNUSED) {
    PyObject *py_retval;
    int c_retval;

    if (libxml_deprecationWarning("xmlSchemaInitTypes") == -1)
        return(NULL);

    c_retval = xmlSchemaInitTypes();
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}